

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O3

int __thiscall CNscContext::GetTypeSize(CNscContext *this,NscType nType)

{
  int iVar1;
  NscSymbol *pNVar2;
  
  iVar1 = 1;
  switch(nType) {
  case NscType_Action:
    iVar1 = 0;
    break;
  case NscType_Integer:
  case NscType_Float:
  case NscType_String:
  case NscType_Object:
  case NscType_Engine_2:
    break;
  case NscType_Vector:
    iVar1 = 3;
    break;
  default:
    if (nType == NscType_Engine_7) {
      return 1;
    }
  case NscType_Statement:
  case NscType_Struct:
  case NscType_Vector|NscType_Void:
  case NscType_String|NscType_Statement:
  case NscType_String|NscType_Struct:
  case NscType_String|NscType_Integer:
  case NscType_String|NscType_Float:
  case NscType_Engine_0:
  case NscType_Engine_1:
    if (((nType & ~(NscType_String|NscType_Float)) != NscType_Engine_0) &&
       (iVar1 = 0, 0x1f < (int)nType)) {
      pNVar2 = GetStructSymbol(this,nType);
      iVar1 = *(int *)((this->m_sSymbols).m_pauchData + (pNVar2->field_6).field_1.nFirstBackLink + 4
                      );
    }
  }
  return iVar1;
}

Assistant:

int CNscContext::GetTypeSize (NscType nType)
{

	//
	// Switch based on the type
	//

	switch (nType)
	{
		case NscType_Integer:
		case NscType_Float:
		case NscType_String:
		case NscType_Object:
		case NscType_Engine_2: // location
		case NscType_Engine_7: // json
			return 1;

		case NscType_Vector:
			return 3;

		case NscType_Action:
			return 0;

		//
		// Default case catches all the other types
		//

		default:

			//
			// If this is an engine type
			//

			if (nType >= NscType_Engine_0 &&
				nType < NscType_Struct_0)
			{
				return 1;
			}

			//
			// If we have a structure
			//

			else if (nType >= NscType_Struct_0)
			{

				//
				// Loop through the values in the structure
				// and add them as variables.
				//

				NscSymbol *pSymbol = GetStructSymbol (nType);
				unsigned char *pauchData = m_sSymbols .GetData (pSymbol ->nExtra);
				NscSymbolStructExtra *pExtra = (NscSymbolStructExtra *) pauchData;
				return pExtra ->nTotalSize;
			}

			//
			// Otherwise, error.  Unknown type
			//

			else
			{
				return 0;
			}
			break;
	}
}